

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.cc
# Opt level: O2

void __thiscall dynet::Trainer::update(Trainer *this,real scale)

{
  uint uVar1;
  Model *pMVar2;
  uint *puVar3;
  __node_base *p_Var4;
  uint *puVar5;
  ulong uVar6;
  float fVar7;
  undefined1 auVar8 [16];
  
  if (this->aux_allocated == false) {
    (*this->_vptr_Trainer[2])(this);
    this->aux_allocated = true;
  }
  fVar7 = clip_gradients(this,scale);
  pMVar2 = this->model;
  puVar3 = (pMVar2->updated_params).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (puVar5 = (pMVar2->updated_params).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start; puVar5 != puVar3; puVar5 = puVar5 + 1) {
    uVar1 = *puVar5;
    (*this->_vptr_Trainer[4])((ulong)(uint)scale,(ulong)(uint)fVar7,this,(ulong)uVar1);
    ParameterStorage::clear
              ((pMVar2->params).
               super__Vector_base<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar1]);
  }
  pMVar2 = this->model;
  puVar3 = (pMVar2->updated_lookup_params).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar5 = (pMVar2->updated_lookup_params).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start; puVar5 != puVar3; puVar5 = puVar5 + 1) {
    uVar6 = (ulong)*puVar5;
    if (this->sparse_updates_enabled == true) {
      p_Var4 = &((pMVar2->lookup_params).
                 super__Vector_base<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar6]->non_zero_grads)._M_h.
                _M_before_begin;
      while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
        (*this->_vptr_Trainer[5])
                  ((ulong)(uint)scale,(ulong)(uint)fVar7,this,uVar6,
                   (ulong)(uint)*(size_type *)(p_Var4 + 1));
      }
    }
    else {
      (*this->_vptr_Trainer[6])((ulong)(uint)scale,(ulong)(uint)fVar7,this,uVar6);
    }
    LookupParameterStorage::clear
              ((pMVar2->lookup_params).
               super__Vector_base<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar6]);
  }
  this->updates = this->updates + 1.0;
  this->updates_since_status = this->updates_since_status + 1.0;
  pMVar2 = this->model;
  auVar8 = ZEXT416((uint)(pMVar2->weight_decay).weight_decay);
  auVar8 = vfnmadd132ss_fma(auVar8,auVar8,ZEXT416((uint)(pMVar2->weight_decay).lambda));
  (pMVar2->weight_decay).weight_decay = auVar8._0_4_;
  if (auVar8._0_4_ < 0.25) {
    rescale_and_reset_weight_decay(this);
    return;
  }
  return;
}

Assistant:

void Trainer::update(real scale) {
  // Allocate if necessary
  if(!aux_allocated) {
    alloc_impl();
    aux_allocated = true;
  }

  // Perform gradient clipping and cycle through parameters
  const float gscale = clip_gradients(scale);
  const auto & params = model->parameters_list();
  const auto & upd_params = model->updated_parameters_list();
  for(auto i : upd_params) {
    update_params(scale, gscale, i);
    params[i]->clear();
  }
  const auto & lookup_params = model->lookup_parameters_list();
  const auto & upd_lookup_params = model->updated_lookup_parameters_list();
  for(auto i : upd_lookup_params) {
    if(sparse_updates_enabled) {
      for (auto j : lookup_params[i]->non_zero_grads)
        update_lookup_params(scale, gscale, i, j);
    } else {
      update_lookup_params(scale, gscale, i);
    }
    lookup_params[i]->clear();
  }
  ++updates;
  ++updates_since_status;

  model->weight_decay.update_weight_decay(); // update global weight scale
  if (model->weight_decay.parameters_need_rescaled())
    rescale_and_reset_weight_decay();  // if wdscale is getting to small multiply all weights by wdscale, and set wdscale to 1
}